

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# subset_iterator.hpp
# Opt level: O2

void __thiscall
burst::
subset_iterator<const_char_*,_std::less<void>,_std::vector<const_char_*,_std::allocator<const_char_*>_>_>
::subset_iterator(subset_iterator<const_char_*,_std::less<void>,_std::vector<const_char_*,_std::allocator<const_char_*>_>_>
                  *this,char *first,char *last)

{
  bool bVar1;
  allocator_type local_11;
  
  this->m_begin = first;
  this->m_end = last;
  std::vector<const_char_*,_std::allocator<const_char_*>_>::vector
            (&this->m_subset,(long)last - (long)first,&local_11);
  this->m_subset_size = 0;
  bVar1 = std::is_sorted<char_const*,std::less<void>>(this->m_begin,this->m_end);
  if (bVar1) {
    increment(this);
    return;
  }
  __assert_fail("std::is_sorted(m_begin, m_end, m_compare)",
                "/workspace/llm4binary/github/license_c_cmakelists/izvolov[P]burst/include/burst/iterator/subset_iterator.hpp"
                ,0x5d,
                "burst::subset_iterator<const char *>::subset_iterator(ForwardIterator, ForwardIterator, compare_type) [ForwardIterator = const char *, Compare = std::less<void>, SubsetContainer = std::vector<const char *>]"
               );
}

Assistant:

explicit subset_iterator
            (
                ForwardIterator first, ForwardIterator last,
                compare_type compare = compare_type{}
            ):
            m_begin(std::move(first)),
            m_end(std::move(last)),
            m_subset(static_cast<std::size_t>(std::distance(m_begin, m_end))),
            m_subset_size(0),
            m_compare(compare)
        {
            BOOST_ASSERT(std::is_sorted(m_begin, m_end, m_compare));
            increment();
        }